

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.c
# Opt level: O1

int formt_(integer *m,doublereal *wt,doublereal *sy,doublereal *ss,integer *col,doublereal *theta,
          integer *info)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  doublereal *pdVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  double dVar13;
  
  uVar8 = (ulong)*m;
  uVar9 = ~uVar8;
  uVar1 = *col;
  uVar10 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    lVar11 = uVar9 * 8 + uVar8 * 8 + 8;
    do {
      *(double *)((long)wt + lVar11) = *theta * *(double *)((long)ss + lVar11);
      lVar11 = lVar11 + uVar8 * 8;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  if (1 < (int)uVar1) {
    uVar7 = 2;
    lVar6 = 0x10;
    uVar10 = uVar7;
    lVar11 = lVar6;
    do {
      do {
        uVar2 = uVar7;
        if ((int)uVar10 < (int)uVar7) {
          uVar2 = uVar10;
        }
        dVar13 = 0.0;
        uVar3 = 1;
        pdVar5 = sy + uVar8 + uVar9;
        pdVar12 = sy + uVar8 + uVar9 + 1;
        do {
          dVar13 = dVar13 + (*(double *)((long)pdVar5 + lVar11) * *(double *)((long)pdVar5 + lVar6))
                            / *pdVar12;
          uVar3 = uVar3 + 1;
          pdVar12 = pdVar12 + uVar8 + 1;
          pdVar5 = pdVar5 + uVar8;
        } while (uVar3 < (uVar2 & 0xffffffff));
        lVar4 = uVar7 * uVar8 + uVar10;
        wt[uVar9 + lVar4] = *theta * ss[uVar9 + lVar4] + dVar13;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 8;
      } while (uVar7 != uVar1 + 1);
      uVar7 = uVar10 + 1;
      lVar6 = lVar11 + 8;
      uVar10 = uVar7;
      lVar11 = lVar6;
    } while (uVar7 != uVar1 + 1);
  }
  dpofa_(wt,m,col,info);
  if (*info != 0) {
    *info = -3;
  }
  return 0;
}

Assistant:

int formt_(integer *m, doublereal *wt, doublereal *sy, 
	doublereal *ss, integer *col, doublereal *theta, integer *info)
{
    /* System generated locals */
    integer wt_dim1, wt_offset, sy_dim1, sy_offset, ss_dim1, ss_offset, i__1, 
	    i__2, i__3;

    /* Local variables */
    static integer i__, j, k, k1;
    static doublereal ddum;
    extern /* Subroutine */ int dpofa_(doublereal *, integer *, integer *, 
	    integer *);

/*     ************ */

/*     Subroutine formt */

/*       This subroutine forms the upper half of the pos. def. and symm. */
/*         T = theta*SS + L*D^(-1)*L', stores T in the upper triangle */
/*         of the array wt, and performs the Cholesky factorization of T */
/*         to produce J*J', with J' stored in the upper triangle of wt. */

/*     Subprograms called: */

/*       Linpack ... dpofa. */


/*                           *  *  * */

/*     NEOS, November 1994. (Latest revision June 1996.) */
/*     Optimization Technology Center. */
/*     Argonne National Laboratory and Northwestern University. */
/*     Written by */
/*                        Ciyou Zhu */
/*     in collaboration with R.H. Byrd, P. Lu-Chen and J. Nocedal. */


/*     ************ */
/*     Form the upper half of  T = theta*SS + L*D^(-1)*L', */
/*        store T in the upper triangle of the array wt. */
    /* Parameter adjustments */
    ss_dim1 = *m;
    ss_offset = 1 + ss_dim1;
    ss -= ss_offset;
    sy_dim1 = *m;
    sy_offset = 1 + sy_dim1;
    sy -= sy_offset;
    wt_dim1 = *m;
    wt_offset = 1 + wt_dim1;
    wt -= wt_offset;

    /* Function Body */
    i__1 = *col;
    for (j = 1; j <= i__1; ++j) {
	wt[j * wt_dim1 + 1] = *theta * ss[j * ss_dim1 + 1];
/* L52: */
    }
    i__1 = *col;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *col;
	for (j = i__; j <= i__2; ++j) {
	    k1 = min(i__,j) - 1;
	    ddum = 0.;
	    i__3 = k1;
	    for (k = 1; k <= i__3; ++k) {
		ddum += sy[i__ + k * sy_dim1] * sy[j + k * sy_dim1] / sy[k + 
			k * sy_dim1];
/* L53: */
	    }
	    wt[i__ + j * wt_dim1] = ddum + *theta * ss[i__ + j * ss_dim1];
/* L54: */
	}
/* L55: */
    }
/*     Cholesky factorize T to J*J' with */
/*        J' stored in the upper triangle of wt. */
    dpofa_(&wt[wt_offset], m, col, info);
    if (*info != 0) {
	*info = -3;
    }
    return 0;
}